

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,uint profileId,
          uint recursiveInlineDepth,Instr *funcObjCheckInsertInstr)

{
  _func_int **pp_Var1;
  Func *pFVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  BuiltinFunction BVar5;
  OpndKind OVar6;
  byte bVar7;
  ArgSlot AVar8;
  OpCode OVar9;
  uint uVar10;
  BuiltInFlags flags;
  int iVar11;
  uint uVar12;
  RegSlot RVar13;
  RegSlot RVar14;
  undefined4 *puVar15;
  Instr *pIVar16;
  char16 *inlineeName;
  FunctionJITTimeInfo *topFunc;
  StackSym *pSVar17;
  ByteCodeUsesInstr *pBVar18;
  StackSym *pSVar19;
  SymOpnd *dstOpnd;
  Opnd *pOVar20;
  Opnd *src2Opnd;
  Instr *pIVar21;
  RegOpnd *pRVar22;
  Instr *pIVar23;
  AddrOpnd *src2Opnd_00;
  RegOpnd *opnd;
  _func_int *p_Var24;
  uint uVar25;
  FunctionJITTimeInfo *inlineeData_00;
  Inline *this_00;
  Instr *pIVar26;
  Opnd *local_68;
  Opnd *local_50;
  
  if (callInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x804,"(callInstr)","callInstr");
    if (!bVar4) goto LAB_00543304;
    *puVar15 = 0;
  }
  if (inlinerData == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x805,"(inlinerData)","inlinerData");
    if (!bVar4) goto LAB_00543304;
    *puVar15 = 0;
  }
  if (inlineCallOpCode == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x806,"(inlineCallOpCode != 0)","inlineCallOpCode != 0");
    if (!bVar4) goto LAB_00543304;
    *puVar15 = 0;
  }
  *pIsInlined = false;
  uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
  BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar10);
  bVar4 = CanInlineBuiltInFunction
                    (this,callInstr,inlineeData_00,inlineCallOpCode,inlinerData,BVar5,false);
  if (bVar4) {
    flags = Js::JavascriptLibrary::GetFlagsForBuiltIn(BVar5);
    local_50 = callInstr->m_src2;
    OVar6 = IR::Opnd::GetKind(local_50);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_00543304;
      *puVar15 = 0;
    }
    pSVar17 = (StackSym *)local_50[1]._vptr_Opnd;
    if ((pSVar17->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_00543304;
      *puVar15 = 0;
    }
    AVar8 = StackSym::GetArgSlotNum(pSVar17);
    iVar11 = (AVar8 - 1) + (uint)((flags >> 0xc & 1) != 0);
    if (inlineCallOpCode == InlineFunctionApply) {
      pIVar16 = InlineApply(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,
                            profileId,recursiveInlineDepth,iVar11 - (uint)((flags >> 0xc & 1) != 0))
      ;
      return pIVar16;
    }
    if ((inlineCallOpCode & ~ExtendedOpcodePrefix) == InlineFunctionCall) {
      pIVar16 = InlineCall(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,profileId
                           ,recursiveInlineDepth,inlineCallOpCode == InlineCallInstanceFunction);
      return pIVar16;
    }
    inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(BVar5);
    topFunc = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    bVar4 = JITTimeWorkItem::IsLoopBody(callInstr->m_func->topFunc->m_workItem);
    TraceInlining(inlinerData,inlineeName,(char16 *)0x0,0,topFunc,0,(FunctionJITTimeInfo *)0x0,
                  profileId,bVar4,(uint)BVar5._value);
    *pIsInlined = true;
    pSVar17 = IR::Opnd::GetStackSym(callInstr->m_src1);
    bVar7 = callInstr->m_src1->field_0xb;
    pBVar18 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,funcObjCheckInsertInstr,inlineeData,false,true,false,true);
    if (inlineCallOpCode == CallDirect) {
      pSVar19 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
      dstOpnd = IR::SymOpnd::New(&pSVar19->super_Sym,0,TyUint64,callInstr->m_func);
      pOVar20 = IR::Instr::UnlinkSrc1(callInstr);
      src2Opnd = IR::Instr::UnlinkSrc2(callInstr);
      pIVar16 = IR::Instr::New(ArgOut_A_InlineSpecialized,&dstOpnd->super_Opnd,pOVar20,src2Opnd,
                               callInstr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar16,callInstr);
      pIVar21 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(callInstr);
      IR::Instr::InsertBefore(pIVar21,pIVar16);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
      this_00 = (Inline *)(ulong)uVar10;
      BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar10);
      callInstr->m_opcode = CallDirect;
      SetupInlineInstrForCallDirect(this_00,BVar5,callInstr,pIVar16);
      WrapArgsOutWithCoerse(this_00,BVar5,callInstr);
      IR::Instr::MoveArgs(callInstr,true);
      pIVar16 = callInstr;
    }
    else {
      pIVar16 = InsertInlineeBuiltInStartEndTags(this,callInstr,(uint)AVar8,(Instr **)0x0);
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar16->m_opcode = InlineNonTrackingBuiltInEnd;
      }
    }
    if (pBVar18 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Unlink(&pBVar18->super_Instr);
      IR::Instr::InsertBefore(callInstr,&pBVar18->super_Instr);
    }
    bVar4 = Js::JavascriptLibrary::IsTypeSpecRequired(flags);
    if (bVar4) {
      OVar9 = pIVar16->m_opcode;
      pIVar21 = pIVar16;
      while (OVar9 != InlineBuiltInStart) {
        pIVar21 = pIVar21->m_prev;
        OVar9 = pIVar21->m_opcode;
      }
      local_68 = callInstr->m_dst;
      if (inlineCallOpCode == InlineArrayPop || local_68 == (Opnd *)0x0) {
        if (1 < (ushort)(inlineCallOpCode - InlineArrayPop)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar15 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x873,
                             "(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop)"
                             ,"Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
          if (!bVar4) goto LAB_00543304;
          *puVar15 = 0;
        }
        pRVar22 = (RegOpnd *)0x0;
      }
      else {
        pSVar19 = StackSym::New(local_68->m_type,callInstr->m_func);
        pRVar22 = IR::RegOpnd::New(pSVar19,pSVar19->m_type,callInstr->m_func);
        local_68 = IR::Instr::UnlinkDst(callInstr);
        IR::Instr::SetDst(callInstr,&pRVar22->super_Opnd);
      }
      pIVar23 = IR::Instr::GetPrevRealInstrOrLabel(callInstr);
      pBVar18 = IR::ByteCodeUsesInstr::New(pIVar23);
      IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                (pBVar18,(bool)((bVar7 & 8) >> 3),(pSVar17->super_Sym).m_id);
      pIVar23 = pIVar16;
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar23 = callInstr;
      }
      IR::Instr::InsertBefore(pIVar23,&pBVar18->super_Instr);
      if (pRVar22 != (RegOpnd *)0x0) {
        OVar9 = Func::GetLoadOpForType(local_68->m_type);
        pIVar23 = IR::Instr::New(OVar9,local_68,&pRVar22->super_Opnd,callInstr->m_func);
        IR::Instr::InsertBefore(pIVar16,pIVar23);
      }
      IR::Instr::UnlinkSrc1(callInstr);
      IR::Instr::UnlinkSrc2(callInstr);
      callInstr->m_opcode = inlineCallOpCode;
      pBVar18 = IR::ByteCodeUsesInstr::New(callInstr);
      pSVar17 = IR::Opnd::GetStackSym(pIVar16->m_src2);
      pIVar23 = (pSVar17->field_5).m_instrDef;
      if ((pIVar23 != (Instr *)0x0 & pSVar17->field_0x18) == 1) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar4) goto LAB_00543304;
        *puVar15 = 0;
        pIVar23 = (pSVar17->field_5).m_instrDef;
      }
      do {
        if ((pIVar23->m_src2 == (Opnd *)0x0) ||
           (OVar6 = IR::Opnd::GetKind(pIVar23->m_src2), OVar6 != OpndKindSym)) {
LAB_00542b46:
          pIVar26 = (Instr *)0x0;
        }
        else {
          pOVar20 = pIVar23->m_src2;
          OVar6 = IR::Opnd::GetKind(pOVar20);
          if (OVar6 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar4) goto LAB_00543304;
            *puVar15 = 0;
          }
          pp_Var1 = pOVar20[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar4) goto LAB_00543304;
            *puVar15 = 0;
          }
          uVar12 = *(uint *)(pp_Var1 + 3);
          uVar25 = uVar12 & 0x100000;
          if ((uVar25 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar4) goto LAB_00543304;
            *puVar15 = 0;
            uVar12 = *(uint *)(pp_Var1 + 3);
            uVar25 = uVar12 & 0x100000;
          }
          if (uVar25 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar4) goto LAB_00543304;
            *puVar15 = 0;
            uVar12 = *(uint *)(pp_Var1 + 3);
          }
          if (((((uVar12 & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) &&
              (bVar4 = Func::IsInPhase(pIVar16->m_func,FGPeepsPhase), !bVar4)) &&
             (bVar4 = Func::IsInPhase(pIVar16->m_func,FGBuildPhase), !bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar4) goto LAB_00543304;
            *puVar15 = 0;
          }
          if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_00542b46;
          pIVar26 = (Instr *)pp_Var1[5];
        }
        if (pIVar23->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar23->m_opcode == StartCall) {
            if (pIVar26 != (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                 ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
              if (!bVar4) goto LAB_00543304;
              *puVar15 = 0;
            }
            break;
          }
          pSVar17 = IR::Opnd::GetStackSym(local_50);
          pSVar17->field_0x19 = pSVar17->field_0x19 | 0x50;
          bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
          if (bVar4) {
            pSVar17 = IR::Opnd::GetStackSym(pIVar23->m_src1);
            uVar12 = *(uint *)&pSVar17->field_0x18;
            if ((uVar12 >> 0xd & 1) != 0) {
              if (((uVar12 & 1) != 0) &&
                 (pOVar20 = ((pSVar17->field_5).m_instrDef)->m_src1, pOVar20 != (Opnd *)0x0)) {
                OVar6 = IR::Opnd::GetKind(pOVar20);
                if ((((OVar6 == OpndKindIntConst) ||
                     ((OVar6 = IR::Opnd::GetKind(pOVar20), OVar6 == OpndKindInt64Const ||
                      (OVar6 = IR::Opnd::GetKind(pOVar20), OVar6 == OpndKindAddr)))) ||
                    (OVar6 = IR::Opnd::GetKind(pOVar20), OVar6 == OpndKindHelperCall)) ||
                   ((OVar6 = IR::Opnd::GetKind(pOVar20), OVar6 == OpndKindFloatConst ||
                    (OVar6 = IR::Opnd::GetKind(pOVar20), OVar6 == OpndKindSimd128Const))))
                goto LAB_00542c29;
                uVar12 = *(uint *)&pSVar17->field_0x18;
              }
              if ((uVar12 >> 0x12 & 1) == 0) {
                RVar13 = StackSym::GetByteCodeRegSlot(pSVar17);
                pSVar17 = IR::Opnd::GetStackSym(local_68);
                RVar14 = StackSym::GetByteCodeRegSlot(pSVar17);
                if (RVar13 != RVar14) {
                  IR::ByteCodeUsesInstr::Set(pBVar18,pIVar23->m_src1);
                }
              }
            }
          }
LAB_00542c29:
          pIVar23->m_opcode = ArgOut_A_InlineBuiltIn;
          IR::Instr::GenerateBytecodeArgOutCapture(pIVar23);
          pOVar20 = pIVar23->m_src1;
          if (iVar11 == 1) {
            if (callInstr->m_src1 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x16c,"(this->m_src1 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar4) goto LAB_00543304;
              *puVar15 = 0;
            }
            pFVar2 = callInstr->m_func;
            if (pOVar20->isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar4) goto LAB_00543304;
              *puVar15 = 0;
            }
            bVar7 = pOVar20->field_0xb;
            if ((bVar7 & 2) != 0) {
              pOVar20 = IR::Opnd::Copy(pOVar20,pFVar2);
              bVar7 = pOVar20->field_0xb;
            }
            pOVar20->field_0xb = bVar7 | 2;
            callInstr->m_src1 = pOVar20;
LAB_00542e07:
            IR::Opnd::SetIsJITOptimizedReg(pOVar20,true);
          }
          else if (iVar11 == 2) {
            if (callInstr->m_src2 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x18b,"(this->m_src2 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar4) goto LAB_00543304;
              *puVar15 = 0;
            }
            pFVar2 = callInstr->m_func;
            if (pOVar20->isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar4) goto LAB_00543304;
              *puVar15 = 0;
            }
            bVar7 = pOVar20->field_0xb;
            if ((bVar7 & 2) != 0) {
              pOVar20 = IR::Opnd::Copy(pOVar20,pFVar2);
              bVar7 = pOVar20->field_0xb;
            }
            pOVar20->field_0xb = bVar7 | 2;
            callInstr->m_src2 = pOVar20;
            goto LAB_00542e07;
          }
          iVar11 = iVar11 + -1;
          local_50 = pIVar23->m_src2;
          IR::Instr::Move(pIVar23,pIVar21);
          pIVar21 = pIVar23;
        }
        pIVar23 = pIVar26;
      } while (pIVar26 != (Instr *)0x0);
      if ((inlineCallOpCode == InlineMathImul) || (inlineCallOpCode == InlineMathClz)) {
        pFVar2 = callInstr->m_func;
        src2Opnd_00 = IR::AddrOpnd::NewFromNumber(0,pFVar2,true);
        pRVar22 = IR::RegOpnd::New(TyVar,pFVar2);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar22->super_Opnd,true);
        pOVar20 = IR::Instr::UnlinkSrc1(callInstr);
        pIVar21 = IR::Instr::New(Or_A,&pRVar22->super_Opnd,pOVar20,&src2Opnd_00->super_Opnd,pFVar2);
        IR::Instr::SetByteCodeOffset(pIVar21,callInstr);
        IR::Instr::InsertBefore(callInstr,pIVar21);
        if (callInstr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar15 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_00543304;
          *puVar15 = 0;
        }
        func = callInstr->m_func;
        if ((pRVar22->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar15 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_00543304;
          *puVar15 = 0;
        }
        bVar7 = (pRVar22->super_Opnd).field_0xb;
        opnd = pRVar22;
        if ((bVar7 & 2) != 0) {
          opnd = (RegOpnd *)IR::Opnd::Copy(&pRVar22->super_Opnd,func);
          bVar7 = (opnd->super_Opnd).field_0xb;
        }
        (opnd->super_Opnd).field_0xb = bVar7 | 2;
        callInstr->m_src1 = &opnd->super_Opnd;
        if (inlineCallOpCode == InlineMathImul) {
          bVar4 = IR::Opnd::IsEqual(callInstr->m_src2,&opnd->super_Opnd);
          if (bVar4) {
            IR::Instr::ReplaceSrc2(callInstr,&pRVar22->super_Opnd);
          }
          else {
            pRVar22 = IR::RegOpnd::New(TyVar,pFVar2);
            IR::Opnd::SetIsJITOptimizedReg(&pRVar22->super_Opnd,true);
            pOVar20 = IR::Instr::UnlinkSrc2(callInstr);
            pIVar21 = IR::Instr::New(Or_A,&pRVar22->super_Opnd,pOVar20,&src2Opnd_00->super_Opnd,
                                     pFVar2);
            IR::Instr::SetByteCodeOffset(pIVar21,callInstr);
            IR::Instr::InsertBefore(callInstr,pIVar21);
            IR::Instr::SetSrc2(callInstr,&pRVar22->super_Opnd);
          }
        }
      }
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::InsertBefore(pIVar16,&pBVar18->super_Instr);
      }
      OVar6 = IR::Opnd::GetKind(local_50);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_00543304;
        *puVar15 = 0;
      }
      if (((ulong)local_50[1]._vptr_Opnd[3] & 1) == 0) {
        p_Var24 = (_func_int *)0x0;
      }
      else {
        p_Var24 = local_50[1]._vptr_Opnd[5];
      }
      if (*(short *)(p_Var24 + 0x30) != 7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8ea,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                          );
        if (!bVar4) goto LAB_00543304;
        *puVar15 = 0;
      }
      OVar6 = IR::Opnd::GetKind(local_50);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_00543304;
        *puVar15 = 0;
      }
      pIVar21 = (Instr *)0x0;
      if (((ulong)local_50[1]._vptr_Opnd[3] & 1) != 0) {
        pIVar21 = (Instr *)local_50[1]._vptr_Opnd[5];
      }
      uVar10 = IR::Instr::GetArgOutCount(pIVar21,false);
      if (uVar10 != AVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8eb,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount"
                          );
        if (!bVar4) goto LAB_00543304;
        *puVar15 = 0;
      }
      OVar6 = IR::Opnd::GetKind(local_50);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_00543304:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar15 = 0;
      }
      *(uint *)(local_50[1]._vptr_Opnd + 3) = *(uint *)(local_50[1]._vptr_Opnd + 3) | 0x4000;
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::ConvertToBailOutInstr(callInstr,callInstr,BailOutOnFloor,0xffffffff);
      }
    }
    pIVar16 = pIVar16->m_next;
  }
  else {
    pIVar16 = callInstr->m_next;
  }
  return pIVar16;
}

Assistant:

IR::Instr *
Inline::InlineBuiltInFunction(
    IR::Instr *callInstr,
    const FunctionJITTimeInfo * inlineeData,
    Js::OpCode inlineCallOpCode,
    const FunctionJITTimeInfo * inlinerData, 
    const StackSym *symCallerThis, 
    bool* pIsInlined, 
    uint profileId, 
    uint recursiveInlineDepth, 
    IR::Instr * funcObjCheckInsertInstr)
{
    Assert(callInstr);
    Assert(inlinerData);
    Assert(inlineCallOpCode != 0);

    // We may still decide not to inline.
    *pIsInlined = false;

    // Inlining is profile-based, so get the built-in function from profile rather than from the callInstr's opnd.
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
    if (!CanInlineBuiltInFunction(callInstr, inlineeData, inlineCallOpCode, inlinerData, builtInId, false))
    {
        return callInstr->m_next;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    IR::Opnd * linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();

    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);

    IR::Instr *inlineBuiltInEndInstr = nullptr;
    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply)
    {
        return InlineApply(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, inlineCallArgCount - (usesThisArgument ? 1 : 0));
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionCall || inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction)
    {
        const bool isCallInstanceFunction = (inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction);
        return InlineCall(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, isCallInstanceFunction);
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, profileId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    // From now on we are committed to inlining.
    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr* useCallTargetInstr = EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, funcObjCheckInsertInstr, inlineeData, false, true, false, true);

    // To push function object for cases when we have to make calls to helper method to assist in inlining
    if (inlineCallOpCode == Js::OpCode::CallDirect)
    {
        IR::Instr* argoutInstr;
        StackSym *dstSym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
        argoutInstr = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, IR::SymOpnd::New(dstSym, 0, TyMachPtr, callInstr->m_func), callInstr->UnlinkSrc1(), callInstr->UnlinkSrc2(), callInstr->m_func);
        argoutInstr->SetByteCodeOffset(callInstr);
        callInstr->GetInsertBeforeByteCodeUsesInstr()->InsertBefore(argoutInstr);

        Js::BuiltinFunction builtInFunctionId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());


        callInstr->m_opcode = inlineCallOpCode;
        SetupInlineInstrForCallDirect(builtInFunctionId, callInstr, argoutInstr);

        WrapArgsOutWithCoerse(builtInFunctionId, callInstr);

        // Generate ByteCodeArgOutCaptures and move the ArgOut_A/ArgOut_A_Inline close to the call instruction
        callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

        inlineBuiltInEndInstr = callInstr;
    }
    else
    {
        inlineBuiltInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);

        // InlineArrayPop - TrackCalls Need to be done at InlineArrayPop and not at the InlineBuiltInEnd
        // Hence we use a new opcode, to detect that it is an InlineArrayPop and we don't track the call during End of inlineBuiltInCall sequence
        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            inlineBuiltInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;
        }
    }

    if (useCallTargetInstr)
    {
        useCallTargetInstr->Unlink();
        callInstr->InsertBefore(useCallTargetInstr);
    }

    if (Js::JavascriptLibrary::IsTypeSpecRequired(builtInFlags))
    {
        // Emit byteCodeUses for function object
        IR::Instr * inlineBuiltInStartInstr = inlineBuiltInEndInstr;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Opnd * tmpDst = nullptr;
        IR::Opnd * callInstrDst = callInstr->GetDst();

        if (callInstrDst && inlineCallOpCode != Js::OpCode::InlineArrayPop)
        {
            StackSym * tmpSym = StackSym::New(callInstr->GetDst()->GetType(), callInstr->m_func);
            tmpDst = IR::RegOpnd::New(tmpSym, tmpSym->GetType(), callInstr->m_func);

            callInstrDst = callInstr->UnlinkDst();
            callInstr->SetDst(tmpDst);
        }
        else
        {
            AssertMsg(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop,
                "Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
        }

        // Insert a byteCodeUsesInstr to make sure the function object's lifetime is extended beyond the last bailout point
        // at which we may need to call the inlinee again in the interpreter.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr->GetPrevRealInstrOrLabel());
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);

        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            callInstr->InsertBefore(useCallTargetInstr);
        }
        else
        {
            inlineBuiltInEndInstr->InsertBefore(useCallTargetInstr);
        }

        if (tmpDst)
        {
            IR::Instr * ldInstr = IR::Instr::New(Func::GetLoadOpForType(callInstrDst->GetType()), callInstrDst, tmpDst, callInstr->m_func);
            inlineBuiltInEndInstr->InsertBefore(ldInstr);
        }

        // Set srcs of the callInstr, and process ArgOuts.
        callInstr->UnlinkSrc1();
        callInstr->UnlinkSrc2();
        callInstr->m_opcode = inlineCallOpCode;

        int argIndex = inlineCallArgCount;    // We'll use it to fill call instr srcs from upper to lower.


        IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Instr *argInsertInstr = inlineBuiltInStartInstr;

        inlineBuiltInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
            StackSym *linkSym = linkOpnd->GetStackSym();
            linkSym->m_isInlinedArgSlot = true;
            linkSym->m_allocated = true;

            // We are going to replace the use on the call (below), insert byte code use if necessary
            if (OpCodeAttr::BailOutRec(inlineCallOpCode))
            {
                StackSym * sym = argInstr->GetSrc1()->GetStackSym();
                if (sym->HasByteCodeRegSlot() && (!sym->m_isSingleDef || !sym->m_instrDef->GetSrc1() || !sym->m_instrDef->GetSrc1()->IsConstOpnd()))
                {
                    if (!sym->IsFromByteCodeConstantTable() && sym->GetByteCodeRegSlot() != callInstrDst->GetStackSym()->GetByteCodeRegSlot())
                    {
                        byteCodeUsesInstr->Set(argInstr->GetSrc1());
                    }
                }
            }

            // Convert the arg out to built in arg out, and get the src of the arg out
            IR::Opnd * argOpnd = ConvertToInlineBuiltInArgOut(argInstr);
            // Use parameter to the inline call to tempDst.
            if (argIndex == 2)
            {
                callInstr->SetSrc2(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc2()->SetIsJITOptimizedReg(true);
            }
            else if (argIndex == 1)
            {
                callInstr->SetSrc1(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            }

            argIndex--;

            linkOpnd = argInstr->GetSrc2();

            // Move the arguments next to the call.
            argInstr->Move(argInsertInstr);
            argInsertInstr = argInstr;
            return false;
        });

        if (inlineCallOpCode == Js::OpCode::InlineMathImul || inlineCallOpCode == Js::OpCode::InlineMathClz)
        {
            // Convert:
            //     s1 = InlineMathImul s2, s3
            // Into:
            //     s4 = Or_A s2, 0
            //     s5 = Or_A s3, 0
            //     s1 = InlineMathImul s4, s5

            Func *const func = callInstr->m_func;
            IR::AddrOpnd *const zeroOpnd = IR::AddrOpnd::NewFromNumber(0, func, true);

            IR::RegOpnd *const s4 = IR::RegOpnd::New(TyVar, func);
            s4->SetIsJITOptimizedReg(true);
            IR::Instr *orInstr = IR::Instr::New(Js::OpCode::Or_A, s4, callInstr->UnlinkSrc1(), zeroOpnd, func);
            orInstr->SetByteCodeOffset(callInstr);
            callInstr->InsertBefore(orInstr);
            callInstr->SetSrc1(s4);
            if (inlineCallOpCode == Js::OpCode::InlineMathImul)
            {
                if (callInstr->GetSrc2()->IsEqual(callInstr->GetSrc1()))
                {
                    callInstr->ReplaceSrc2(s4);
                }
                else
                {
                    IR::RegOpnd *const s5 = IR::RegOpnd::New(TyVar, func);
                    s5->SetIsJITOptimizedReg(true);
                    orInstr = IR::Instr::New(Js::OpCode::Or_A, s5, callInstr->UnlinkSrc2(), zeroOpnd, func);
                    orInstr->SetByteCodeOffset(callInstr);
                    callInstr->InsertBefore(orInstr);
                    callInstr->SetSrc2(s5);
                }
            }
        }

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            inlineBuiltInEndInstr->InsertBefore(byteCodeUsesInstr);
        }

        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall);
        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

        // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
        // and not adjust the stack height on x86
        linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            callInstr = callInstr->ConvertToBailOutInstr(callInstr, IR::BailOutOnFloor);
        }
    }
    return inlineBuiltInEndInstr->m_next;
}